

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceCountQuantity::setUniforms(SurfaceCountQuantity *this,ShaderProgram *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *plVar3;
  float *pfVar4;
  ScaledValue<float> *this_00;
  long *in_RSI;
  long in_RDI;
  float fVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar6;
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar7;
  vec4 vVar8;
  mat4 Pinv;
  mat4 P;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffdf0;
  allocator *paVar9;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [36];
  undefined8 local_fc;
  undefined8 local_f4;
  allocator local_e9;
  string local_e8 [55];
  allocator local_b1;
  string local_b0 [160];
  long *local_10;
  
  local_10 = in_RSI;
  view::getCameraPerspectiveMatrix();
  glm::inverse<4,4,float,(glm::qualifier)0>(in_stack_fffffffffffffdf0);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"u_invProjMatrix",&local_b1);
  pfVar4 = glm::value_ptr<float,(glm::qualifier)0>((mat<4,_4,_float,_(glm::qualifier)0> *)0x3c7501);
  (**(code **)(*plVar3 + 0x38))(plVar3,local_b0,pfVar4);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"u_viewport",&local_e9);
  uVar6 = extraout_XMM0_Qb;
  uVar7 = extraout_XMM1_Qb;
  vVar8 = render::Engine::getCurrentViewport(render::engine);
  auVar1._8_8_ = uVar7;
  auVar1._0_8_ = vVar8._8_8_;
  auVar2._8_8_ = uVar6;
  auVar2._0_8_ = vVar8._0_8_;
  local_fc = vmovlpd_avx(auVar2);
  local_f4 = vmovlpd_avx(auVar1);
  (**(code **)(*plVar3 + 0x50))(local_fc,local_f4,plVar3,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"u_pointRadius",&local_121);
  this_00 = PersistentValue<polyscope::ScaledValue<float>_>::get
                      ((PersistentValue<polyscope::ScaledValue<float>_> *)(in_RDI + 0xe0));
  fVar5 = ScaledValue<float>::asAbsolute(this_00);
  (**(code **)(*plVar3 + 0x28))(fVar5,plVar3,local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"u_rangeLow",&local_149);
  (**(code **)(*plVar3 + 0x28))(*(undefined4 *)(in_RDI + 0xd0),plVar3,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  paVar9 = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"u_rangeHigh",paVar9);
  (**(code **)(*local_10 + 0x28))(*(undefined4 *)(in_RDI + 0xd4),local_10,local_170);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  return;
}

Assistant:

void SurfaceCountQuantity::setUniforms(render::ShaderProgram& p) {
  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  p.setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  p.setUniform("u_viewport", render::engine->getCurrentViewport());

  p.setUniform("u_pointRadius", pointRadius.get().asAbsolute());
  p.setUniform("u_rangeLow", vizRangeLow);
  p.setUniform("u_rangeHigh", vizRangeHigh);
}